

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_test.c
# Opt level: O0

void reject(nng_pipe p,nng_pipe_ev act,void *arg)

{
  testcase *t;
  void *arg_local;
  nng_pipe_ev act_local;
  nng_pipe p_local;
  
  notify(p,act,arg);
  nng_mtx_lock(*(nng_mtx **)((long)arg + 0x28));
  if (*(int *)((long)arg + 0x20) == 0) {
    nng_pipe_close(p);
    *(int *)((long)arg + 0x20) = *(int *)((long)arg + 0x20) + 1;
  }
  nng_mtx_unlock(*(nng_mtx **)((long)arg + 0x28));
  return;
}

Assistant:

void
reject(nng_pipe p, nng_pipe_ev act, void *arg)
{
	struct testcase *t = arg;
	notify(p, act, arg);

	nng_mtx_lock(t->lk);
	if (!t->rej) {
		nng_pipe_close(p);
		t->rej++;
	}
	nng_mtx_unlock(t->lk);
}